

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O0

void __thiscall QTextCursor::mergeCharFormat(QTextCursor *this,QTextCharFormat *modifier)

{
  bool bVar1;
  int iVar2;
  QTextCursorPrivate *pQVar3;
  QSharedDataPointer<QTextCursorPrivate> *in_RDI;
  long in_FS_OFFSET;
  QTextCursor *unaff_retaddr;
  undefined4 in_stack_00000008;
  FormatChangeMode in_stack_0000000c;
  QTextCharFormat format;
  QTextFormat *format_00;
  QTextFormatCollection *this_00;
  
  this_00 = *(QTextFormatCollection **)(in_FS_OFFSET + 0x28);
  bVar1 = QSharedDataPointer<QTextCursorPrivate>::operator!
                    ((QSharedDataPointer<QTextCursorPrivate> *)0x7a556f);
  if ((!bVar1) &&
     (pQVar3 = QSharedDataPointer<QTextCursorPrivate>::operator->(in_RDI),
     pQVar3->priv != (QTextDocumentPrivate *)0x0)) {
    pQVar3 = QSharedDataPointer<QTextCursorPrivate>::operator->(in_RDI);
    iVar2 = pQVar3->position;
    pQVar3 = QSharedDataPointer<QTextCursorPrivate>::operator->(in_RDI);
    if (iVar2 == pQVar3->anchor) {
      format_00 = (QTextFormat *)&DAT_aaaaaaaaaaaaaaaa;
      charFormat(unaff_retaddr);
      QTextFormat::merge(&modifier->super_QTextFormat,
                         (QTextFormat *)CONCAT44(in_stack_0000000c,in_stack_00000008));
      pQVar3 = QSharedDataPointer<QTextCursorPrivate>::operator->(in_RDI);
      QTextDocumentPrivate::formatCollection(pQVar3->priv);
      iVar2 = QTextFormatCollection::indexForFormat(this_00,format_00);
      pQVar3 = QSharedDataPointer<QTextCursorPrivate>::operator->(in_RDI);
      pQVar3->currentCharFormat = iVar2;
      QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7a5623);
    }
    else {
      QSharedDataPointer<QTextCursorPrivate>::operator->(in_RDI);
      QTextCursorPrivate::setCharFormat((QTextCursorPrivate *)this,modifier,in_stack_0000000c);
    }
  }
  if (*(QTextFormatCollection **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextCursor::mergeCharFormat(const QTextCharFormat &modifier)
{
    if (!d || !d->priv)
        return;
    if (d->position == d->anchor) {
        QTextCharFormat format = charFormat();
        format.merge(modifier);
        d->currentCharFormat = d->priv->formatCollection()->indexForFormat(format);
        return;
    }

    d->setCharFormat(modifier, QTextDocumentPrivate::MergeFormat);
}